

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O3

PmError alsa_out_open(PmInternal *midi,void *driverInfo)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  undefined8 uVar6;
  PmError err;
  uint *ptr;
  long lVar7;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  
  pvVar5 = descriptors[midi->device_id].descriptor;
  uStack_40 = 0x104990;
  ptr = (uint *)pm_alloc(0x20);
  if (ptr == (uint *)0x0) {
    return pmInsufficientMemory;
  }
  uStack_40 = 0x1049a1;
  lVar7 = snd_seq_port_info_sizeof();
  lVar7 = -(lVar7 + 0xfU & 0xfffffffffffffff0);
  __s = auStack_38 + lVar7;
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x1049b7;
  __n = snd_seq_port_info_sizeof();
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x1049c4;
  memset(__s,0,__n);
  iVar1 = midi->device_id;
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x1049cf;
  snd_seq_port_info_set_port(__s,iVar1);
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x1049dc;
  snd_seq_port_info_set_capability(__s,3);
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x1049e9;
  snd_seq_port_info_set_type(__s,0x100002);
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x1049f6;
  snd_seq_port_info_set_port_specified(__s,1);
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104a05;
  err = snd_seq_create_port(seq,__s);
  if (~pmNoData < err) {
    midi->descriptor = ptr;
    *ptr = (uint)((ulong)pvVar5 >> 8) & 0xff;
    ptr[1] = (uint)pvVar5 & 0xff;
    ptr[2] = midi->device_id;
    ptr[3] = 0;
    ptr[6] = 0;
    *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104a45;
    err = snd_midi_event_new(0x400,ptr + 4);
    if (~pmNoData < err) {
      if (midi->latency < 1) {
        uVar2 = ptr[2];
        uVar3 = *ptr;
        uVar4 = ptr[1];
        *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104aa0;
        err = snd_seq_connect_to(seq,uVar2,uVar3,uVar4);
        if (~pmNoData < err) {
          return pmNoData;
        }
      }
      else {
        *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104a55;
        err = alsa_use_queue();
        if (~pmNoData < err) {
          uVar2 = ptr[2];
          uVar3 = *ptr;
          uVar4 = ptr[1];
          *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104a6d;
          err = snd_seq_connect_to(seq,uVar2,uVar3,uVar4);
          if (~pmNoData < err) {
            return pmNoData;
          }
          *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104a79;
          alsa_unuse_queue();
        }
      }
      uVar6 = *(undefined8 *)(ptr + 4);
      *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104ab3;
      snd_midi_event_free(uVar6);
    }
    uVar2 = ptr[2];
    *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104ac2;
    snd_seq_delete_port(seq,uVar2);
  }
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104aca;
  pm_free(ptr);
  *(undefined8 *)(auStack_38 + lVar7 + -8) = 0x104ae8;
  pm_hosterror = err;
  get_alsa_error_text(pm_hosterror_text,0x100,err);
  return pmHostError;
}

Assistant:

static PmError alsa_out_open(PmInternal *midi, void *driverInfo) 
{
    void *client_port = descriptors[midi->device_id].descriptor;
    alsa_descriptor_type desc = (alsa_descriptor_type) 
        pm_alloc(sizeof(alsa_descriptor_node));
    snd_seq_port_info_t *info;
    int err;

    if (!desc) return pmInsufficientMemory;
    
    snd_seq_port_info_alloca(&info);
    snd_seq_port_info_set_port(info, midi->device_id);
    snd_seq_port_info_set_capability(info, SND_SEQ_PORT_CAP_WRITE |
                                     SND_SEQ_PORT_CAP_READ);
    snd_seq_port_info_set_type(info, SND_SEQ_PORT_TYPE_MIDI_GENERIC | 
                                     SND_SEQ_PORT_TYPE_APPLICATION);
    snd_seq_port_info_set_port_specified(info, 1);
    err = snd_seq_create_port(seq, info);
    if (err < 0) goto free_desc;

    /* fill in fields of desc, which is passed to pm_write routines */
    midi->descriptor = desc;
    desc->client = GET_DESCRIPTOR_CLIENT(client_port);
    desc->port = GET_DESCRIPTOR_PORT(client_port);
    desc->this_port = midi->device_id;
    desc->in_sysex = 0;

    desc->error = 0;

    err = snd_midi_event_new(PM_DEFAULT_SYSEX_BUFFER_SIZE, &desc->parser);
    if (err < 0) goto free_this_port;

    if (midi->latency > 0) { /* must delay output using a queue */
        err = alsa_use_queue();
        if (err < 0) goto free_parser;

        err = snd_seq_connect_to(seq, desc->this_port, desc->client, desc->port);
        if (err < 0) goto unuse_queue;  /* clean up and return on error */
    } else {
        err = snd_seq_connect_to(seq, desc->this_port, desc->client, desc->port);
        if (err < 0) goto free_parser;  /* clean up and return on error */
    }        
    return pmNoError;

 unuse_queue:
    alsa_unuse_queue();
 free_parser:
    snd_midi_event_free(desc->parser);
 free_this_port:
    snd_seq_delete_port(seq, desc->this_port);
 free_desc:
    pm_free(desc);
    pm_hosterror = err;
    if (err < 0) {
        get_alsa_error_text(pm_hosterror_text, PM_HOST_ERROR_MSG_LEN, err);
    }
    return pmHostError;
}